

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_identifier.c
# Opt level: O0

char * mpt_log_identifier(int type)

{
  uint uVar1;
  char *pcStack_10;
  int type_local;
  
  if (type < 1) {
    return (char *)0x0;
  }
  if ((type & 0x20U) == 0) {
    uVar1 = type & 0x1f;
    if (0xf < uVar1) {
      pcStack_10 = "debug";
      return pcStack_10;
    }
    if (7 < uVar1) {
      pcStack_10 = "info";
      return pcStack_10;
    }
    if (3 < uVar1) {
      pcStack_10 = "warning";
      return pcStack_10;
    }
    if (2 < uVar1) {
      pcStack_10 = "error";
      return pcStack_10;
    }
    if (1 < uVar1) {
      pcStack_10 = "critical";
      return pcStack_10;
    }
    if (uVar1 != 0) {
      pcStack_10 = "fatal";
      return pcStack_10;
    }
  }
  else {
    uVar1 = type & 0x1f;
    if (0xf < uVar1) {
      pcStack_10 = "DEBUG";
      return pcStack_10;
    }
    if (7 < uVar1) {
      pcStack_10 = "INFO";
      return pcStack_10;
    }
    if (3 < uVar1) {
      pcStack_10 = "WARNING";
      return pcStack_10;
    }
    if (2 < uVar1) {
      pcStack_10 = "ERROR";
      return pcStack_10;
    }
    if (1 < uVar1) {
      pcStack_10 = "CRITICAL";
      return pcStack_10;
    }
    if (uVar1 != 0) {
      pcStack_10 = "FATAL";
      return pcStack_10;
    }
  }
  return (char *)0x0;
}

Assistant:

extern const char *mpt_log_identifier(int type)
{
	if (type <= 0) {
		return 0;
	}
	if (type & MPT_LOG(File)) {
		type &= 0x1f;
		if (type >= MPT_LOG(Debug))    return "DEBUG";
		if (type >= MPT_LOG(Info))     return "INFO";
		if (type >= MPT_LOG(Warning))  return "WARNING";
		if (type >= MPT_LOG(Error))    return "ERROR";
		if (type >= MPT_LOG(Critical)) return "CRITICAL";
		if (type >= MPT_LOG(Fatal))    return "FATAL";
	} else {
		type &= 0x1f;
		if (type >= MPT_LOG(Debug))    return "debug";
		if (type >= MPT_LOG(Info))     return "info";
		if (type >= MPT_LOG(Warning))  return "warning";
		if (type >= MPT_LOG(Error))    return "error";
		if (type >= MPT_LOG(Critical)) return "critical";
		if (type >= MPT_LOG(Fatal))    return "fatal";
	}
	return 0;
}